

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

void act_clause2_bump(sat_solver2 *s,clause *c)

{
  int *piVar1;
  uint *puVar2;
  clause cVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  cVar3 = c[(ulong)((uint)*c >> 0xb) + 1];
  if ((-1 < (long)(int)cVar3) && ((int)cVar3 < (s->act_clas).size)) {
    piVar4 = (s->act_clas).ptr;
    piVar1 = piVar4 + (int)cVar3;
    *piVar1 = *piVar1 + s->cla_inc;
    if (*piVar1 < 0) {
      for (lVar7 = 0; lVar7 < (s->act_clas).size; lVar7 = lVar7 + 1) {
        puVar2 = (uint *)(piVar4 + lVar7);
        *puVar2 = *puVar2 >> 0xe;
      }
      iVar5 = s->cla_inc >> 0xe;
      iVar6 = 0x400;
      if (0x400 < iVar5) {
        iVar6 = iVar5;
      }
      s->cla_inc = iVar6;
    }
    return;
  }
  __assert_fail("Id >= 0 && Id < veci_size(&s->act_clas)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                ,0x17e,"void act_clause2_bump(sat_solver2 *, clause *)");
}

Assistant:

static inline void act_clause2_bump(sat_solver2* s, clause*c) {
    unsigned * act_clas = (unsigned *)veci_begin(&s->act_clas);
    int Id = clause_id(c);
    assert( Id >= 0 && Id < veci_size(&s->act_clas) );
    act_clas[Id] += s->cla_inc;
    if (act_clas[Id] & 0x80000000)
        act_clause2_rescale(s);
}